

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hxx
# Opt level: O0

size_t lineage::loadEdges(string *fileName,Problem *problem)

{
  bool bVar1;
  istream *piVar2;
  vector<lineage::Edge,_std::allocator<lineage::Edge>_> *this;
  undefined8 in_RDI;
  size_t counter;
  Edge e;
  ifstream file;
  undefined7 in_stack_fffffffffffffd88;
  size_t local_238;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  double local_220;
  istream local_218 [528];
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::clear
            ((vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)0x144af8);
  std::ifstream::ifstream(local_218,local_8,8);
  local_238 = 0;
  while( true ) {
    piVar2 = (istream *)std::istream::operator>>(local_218,&local_230);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_22c);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_228);
    piVar2 = (istream *)std::istream::operator>>(piVar2,&local_224);
    this = (vector<lineage::Edge,_std::allocator<lineage::Edge>_> *)
           std::istream::operator>>(piVar2,&local_220);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&(this->
                                      super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>
                                      )._M_impl.super__Vector_impl_data._M_start +
                              *(long *)((this->
                                        super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>
                                        )._M_impl.super__Vector_impl_data._M_start + -1)));
    if (!bVar1) break;
    std::vector<lineage::Edge,_std::allocator<lineage::Edge>_>::push_back
              (this,(value_type *)CONCAT17(bVar1,in_stack_fffffffffffffd88));
    local_238 = local_238 + 1;
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return local_238;
}

Assistant:

inline
size_t loadEdges(const std::string& fileName, Problem& problem)
{
    problem.edges.clear();

    std::ifstream file(fileName);

    Edge e;
    size_t counter = 0;
    while (file >> e.t0 >> e.v0 >> e.t1 >> e.v1 >> e.weight)
    {
        problem.edges.push_back(e);
        ++counter;
    }

    file.close();

    return counter;
}